

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::GetAttributesWithPropertyIndex
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          BigPropertyIndex index,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContext *this_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  undefined4 *puVar4;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyAttributes *attributes_local;
  BigPropertyIndex index_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  descriptor = (DictionaryPropertyDescriptor<int> *)attributes;
  attributes_local._0_4_ = index;
  attributes_local._4_4_ = propertyId;
  _index_local = instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  local_40 = ScriptContext::GetPropertyName(this_00,attributes_local._4_4_);
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->propertyMap);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_01,&local_40,(DictionaryPropertyDescriptor<int> **)&propertyRecord);
  if (bVar2) {
    iVar3 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>
                      ((DictionaryPropertyDescriptor<int> *)propertyRecord);
    if (iVar3 != (BigPropertyIndex)attributes_local) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x7fe,
                                  "(descriptor->template GetDataPropertyIndex<true>() == index)",
                                  "descriptor->template GetDataPropertyIndex<true>() == index");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x800) == 0) {
      descriptor->flags =
           *(Flags *)((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + 1) &
           (IsAccessor|IsShadowed|PreventFalseReference);
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetAttributesWithPropertyIndex(DynamicObject * instance, PropertyId propertyId, BigPropertyIndex index, PropertyAttributes * attributes)
    {
        // this might get value that are deleted from the dictionary, but that should be nulled out
        DictionaryPropertyDescriptor<T> * descriptor;
        // We can't look it up using the slot index, as one propertyId might have multiple slots,  do the propertyId map lookup
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return false;
        }
        // This function is only used by LdRootFld, so the index will allow let const globals
        Assert(descriptor->template GetDataPropertyIndex<true>() == index);
        if (descriptor->Attributes & PropertyDeleted)
        {
            return false;
        }
        *attributes = descriptor->Attributes & PropertyDynamicTypeDefaults;
        return true;
    }